

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O3

void calc_tv(timeval *tv,timeval *read_tv,timeval *date_tv,char timestamps,int dplace)

{
  __time_t _Var1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined7 in_register_00000009;
  
  iVar4 = (int)CONCAT71(in_register_00000009,timestamps);
  if (iVar4 == 4) {
    lVar2 = 100;
LAB_00102817:
    read_tv->tv_usec = lVar2 * read_tv->tv_usec;
  }
  else if (iVar4 == 5) {
    lVar2 = 10;
    goto LAB_00102817;
  }
  _Var1 = main::date_tv.tv_sec;
  if ((char)date_tv == 'a') {
    lVar3 = read_tv->tv_sec + main::date_tv.tv_sec;
    tv->tv_sec = lVar3;
    lVar2 = read_tv->tv_usec + main::date_tv.tv_usec;
    goto LAB_00102871;
  }
  lVar2 = tv->tv_usec;
  lVar3 = tv->tv_sec;
  if (tv->tv_sec == 0) {
    if (lVar2 == 0) {
      if (main::date_tv.tv_usec != 0 || main::date_tv.tv_sec != 0) {
        tv->tv_sec = main::date_tv.tv_sec;
        lVar2 = main::date_tv.tv_usec;
        tv->tv_usec = main::date_tv.tv_usec;
        lVar3 = _Var1;
        goto LAB_00102867;
      }
      lVar2 = 0;
    }
    lVar3 = 0;
  }
LAB_00102867:
  lVar3 = lVar3 + read_tv->tv_sec;
  tv->tv_sec = lVar3;
  lVar2 = lVar2 + read_tv->tv_usec;
LAB_00102871:
  tv->tv_usec = lVar2;
  if (999999 < lVar2) {
    tv->tv_usec = lVar2 + -1000000;
    tv->tv_sec = lVar3 + 1;
  }
  return;
}

Assistant:

static void calc_tv(struct timeval *tv, struct timeval *read_tv,
		    struct timeval *date_tv, char timestamps, int dplace)
{
	if (dplace == 4) /* shift values having only 4 decimal places */
		read_tv->tv_usec *= 100;                /* and need for 6 */

	if (dplace == 5) /* shift values having only 5 decimal places */
		read_tv->tv_usec *= 10;                /* and need for 6 */

	if (timestamps == 'a') { /* absolute */

		tv->tv_sec  = date_tv->tv_sec  + read_tv->tv_sec;
		tv->tv_usec = date_tv->tv_usec + read_tv->tv_usec;

	} else { /* relative */

		if (((!tv->tv_sec) && (!tv->tv_usec)) && 
		    (date_tv->tv_sec || date_tv->tv_usec)) {
			tv->tv_sec  = date_tv->tv_sec; /* initial date/time */
			tv->tv_usec = date_tv->tv_usec;
		}

		tv->tv_sec  += read_tv->tv_sec;
		tv->tv_usec += read_tv->tv_usec;
	}

	if (tv->tv_usec >= 1000000) {
		tv->tv_usec -= 1000000;
		tv->tv_sec++;
	}
}